

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Parser::IncludePath>::Inserter::insertOne
          (Inserter *this,qsizetype pos,IncludePath *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  IncludePath *pIVar3;
  qsizetype qVar4;
  IncludePath *pIVar5;
  undefined8 uVar6;
  Data *pDVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pIVar3 = this->begin;
  lVar11 = this->size;
  pIVar5 = pIVar3 + lVar11;
  this->end = pIVar5;
  this->last = pIVar3 + lVar11 + -1;
  lVar11 = lVar11 - pos;
  this->where = pIVar3 + pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (0 < lVar11) {
    pDVar7 = pIVar5[-1].path.d.d;
    pcVar8 = pIVar5[-1].path.d.ptr;
    pIVar5[-1].path.d.d = (Data *)0x0;
    pIVar5[-1].path.d.ptr = (char *)0x0;
    (pIVar5->path).d.d = pDVar7;
    (pIVar5->path).d.ptr = pcVar8;
    qVar4 = pIVar5[-1].path.d.size;
    pIVar5[-1].path.d.size = 0;
    (pIVar5->path).d.size = qVar4;
    pIVar5->isFrameworkPath = pIVar5[-1].isFrameworkPath;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pIVar5 = this->last;
        puVar1 = (undefined8 *)((long)&(pIVar5->path).d.d + lVar11);
        uVar6 = *puVar1;
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pIVar5[-1].path.d.d + lVar11);
        uVar10 = puVar2[1];
        puVar1 = (undefined8 *)((long)&(pIVar5->path).d.d + lVar11);
        *puVar1 = *puVar2;
        puVar1[1] = uVar10;
        puVar1 = (undefined8 *)((long)&pIVar5[-1].path.d.d + lVar11);
        *puVar1 = uVar6;
        puVar1[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pIVar5->path).d.size + lVar11);
        *(undefined8 *)((long)&(pIVar5->path).d.size + lVar11) =
             *(undefined8 *)((long)pIVar5 + lVar11 + -0x10);
        *(undefined8 *)((long)pIVar5 + lVar11 + -0x10) = uVar6;
        (&pIVar5->isFrameworkPath)[lVar11] = *(bool *)((long)pIVar5 + lVar11 + -8);
        lVar12 = lVar12 + -1;
        lVar11 = lVar11 + -0x20;
      } while (lVar12 != this->move);
    }
    pIVar5 = this->where;
    pDVar7 = (pIVar5->path).d.d;
    (pIVar5->path).d.d = (t->path).d.d;
    (t->path).d.d = pDVar7;
    pcVar8 = (pIVar5->path).d.ptr;
    (pIVar5->path).d.ptr = (t->path).d.ptr;
    (t->path).d.ptr = pcVar8;
    qVar4 = (pIVar5->path).d.size;
    (pIVar5->path).d.size = (t->path).d.size;
    (t->path).d.size = qVar4;
    pIVar5->isFrameworkPath = t->isFrameworkPath;
    return;
  }
  this->sourceCopyConstruct = 1 - lVar11;
  this->move = 0;
  this->sourceCopyAssign = lVar11;
  pDVar7 = (t->path).d.d;
  (t->path).d.d = (Data *)0x0;
  (pIVar5->path).d.d = pDVar7;
  pcVar8 = (t->path).d.ptr;
  (t->path).d.ptr = (char *)0x0;
  (pIVar5->path).d.ptr = pcVar8;
  qVar4 = (t->path).d.size;
  (t->path).d.size = 0;
  (pIVar5->path).d.size = qVar4;
  pIVar5->isFrameworkPath = t->isFrameworkPath;
  this->size = this->size + 1;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }